

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.cpp
# Opt level: O0

void __thiscall net_uv::UVLoop::free_buf(UVLoop *this,uv_buf_t *buf)

{
  size_type sVar1;
  uv_buf_t *buf_local;
  UVLoop *this_local;
  
  if (buf != (uv_buf_t *)0x0) {
    sVar1 = std::__cxx11::list<uv_buf_t,_std::allocator<uv_buf_t>_>::size(&this->m_freeReadBufList);
    if (sVar1 < 0xb) {
      std::__cxx11::list<uv_buf_t,_std::allocator<uv_buf_t>_>::push_back
                (&this->m_freeReadBufList,buf);
    }
    else {
      free(buf->base);
    }
  }
  return;
}

Assistant:

void UVLoop::free_buf(const uv_buf_t* buf)
{
	if (buf == NULL)
	{
		return;
	}

	if (m_freeReadBufList.size() > 10)
	{
		fc_free(buf->base);
		return;
	}

	m_freeReadBufList.push_back(*buf);
}